

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

Token __thiscall flow::lang::Lexer::parseNumber(Lexer *this,int base)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *__s;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  Lexer *pLStack_18;
  int base_local;
  Lexer *this_local;
  
  local_1c = base;
  pLStack_18 = this;
  std::__cxx11::string::clear();
  this->numberValue_ = 0;
  while( true ) {
    iVar2 = currentChar(this);
    bVar1 = false;
    if (0x2f < iVar2) {
      iVar2 = currentChar(this);
      bVar1 = iVar2 + -0x30 < local_1c;
    }
    if (!bVar1) break;
    this->numberValue_ = (long)local_1c * this->numberValue_;
    iVar2 = currentChar(this);
    this->numberValue_ = (long)(iVar2 + -0x30) + this->numberValue_;
    iVar2 = currentChar(this);
    std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
    nextChar(this,true);
  }
  uVar3 = std::__cxx11::string::size();
  if ((uVar3 < 5) && (iVar2 = currentChar(this), iVar2 == 0x3a)) {
    this_local._4_4_ = continueParseIPv6(this,true);
  }
  else {
    uVar3 = std::__cxx11::string::size();
    if ((uVar3 < 4) && (bVar1 = isHexChar(this), bVar1)) {
      this_local._4_4_ = continueParseIPv6(this,false);
    }
    else {
      iVar2 = currentChar(this);
      if (iVar2 == 0x2e) {
        std::__cxx11::string::operator+=((string *)&this->stringValue_,'.');
        nextChar(this,true);
        while( true ) {
          iVar2 = currentChar(this);
          iVar2 = isdigit(iVar2);
          if (iVar2 == 0) break;
          iVar2 = currentChar(this);
          std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
          nextChar(this,true);
        }
        bVar1 = consume(this,'.');
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)&this->stringValue_,'.');
          while( true ) {
            iVar2 = currentChar(this);
            iVar2 = isdigit(iVar2);
            if (iVar2 == 0) break;
            iVar2 = currentChar(this);
            std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
            nextChar(this,true);
          }
          bVar1 = consume(this,'.');
          if (bVar1) {
            std::__cxx11::string::operator+=((string *)&this->stringValue_,'.');
            while( true ) {
              iVar2 = currentChar(this);
              iVar2 = isdigit(iVar2);
              if (iVar2 == 0) break;
              iVar2 = currentChar(this);
              std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
              nextChar(this,true);
            }
            __s = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
            util::IPAddress::set(&this->ipValue_,&local_40,V4);
            std::__cxx11::string::~string((string *)&local_40);
            std::allocator<char>::~allocator(&local_41);
            iVar2 = currentChar(this);
            if (iVar2 == 0x2f) {
              this_local._4_4_ = continueCidr(this,0x20);
            }
            else {
              this->token_ = IP;
              this_local._4_4_ = IP;
            }
          }
          else {
            this->token_ = Unknown;
            this_local._4_4_ = Unknown;
          }
        }
        else {
          this->token_ = Unknown;
          this_local._4_4_ = Unknown;
        }
      }
      else {
        this->token_ = Number;
        this_local._4_4_ = Number;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

Token Lexer::parseNumber(int base) {
  stringValue_.clear();
  numberValue_ = 0;

  while (currentChar() >= '0' && (currentChar() - '0') < base) {
    numberValue_ *= base;
    numberValue_ += currentChar() - '0';
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  // ipv6HexDigit4 *(':' ipv6HexDigit4) ['::' [ipv6HexSeq]]
  if (stringValue_.size() <= 4 && currentChar() == ':')
    return continueParseIPv6(true);

  if (stringValue_.size() < 4 && isHexChar())
    return continueParseIPv6(false);

  if (currentChar() != '.')
    return token_ = Token::Number;

  // 2nd IP component
  stringValue_ += '.';
  nextChar();
  while (std::isdigit(currentChar())) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  // 3rd IP component
  if (!consume('.')) return token_ = Token::Unknown;

  stringValue_ += '.';
  while (std::isdigit(currentChar())) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  // 4th IP component
  if (!consume('.')) return token_ = Token::Unknown;

  stringValue_ += '.';
  while (std::isdigit(currentChar())) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  ipValue_.set(stringValue_.c_str(), util::IPAddress::Family::V4);

  if (currentChar() != '/') return token_ = Token::IP;

  // IPv4 CIDR
  return continueCidr(32);
}